

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O2

Field google::protobuf::json_internal::Proto3Type::MustHaveField(Desc *d,int32_t number)

{
  undefined8 *puVar1;
  optional<const_google::protobuf::json_internal::ResolverPool::Field_*> oVar2;
  int32_t local_5c;
  LogMessageFatal local_58 [16];
  string local_48;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  FormatSpec<std::basic_string_view<char>,_int> local_18;
  
  local_5c = number;
  oVar2 = FieldByNumber(d,number);
  if (((undefined1  [16])
       oVar2.
       super__Optional_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_true,_true>
       ._M_payload.
       super__Optional_payload_base<const_google::protobuf::json_internal::ResolverPool::Field_*> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return oVar2.
           super__Optional_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_true,_true>
           ._M_payload.
           super__Optional_payload_base<const_google::protobuf::json_internal::ResolverPool::Field_*>
           ._M_payload._M_value;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/json/internal/descriptor_traits.h"
             ,0x154);
  local_18.super_type.spec_.data_ =
       "%s has, by definition, a field numbered %d, but it could not be looked up; this is a bug";
  local_18.super_type.spec_.size_ = 0x58;
  puVar1 = (undefined8 *)
           ((ulong)(d->raw_).field_0._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  local_28._M_str = (char *)*puVar1;
  local_28._M_len = puVar1[1];
  absl::lts_20240722::StrFormat<std::basic_string_view<char,_std::char_traits<char>_>,_int>
            (&local_48,&local_18,&local_28,&local_5c);
  absl::lts_20240722::log_internal::LogMessage::operator<<
            ((LogMessage *)local_58,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_58);
}

Assistant:

static Field MustHaveField(const Desc& d, int32_t number,
                             JsonLocation::SourceLocation loc =
                                 JsonLocation::SourceLocation::current()) {
    auto f = FieldByNumber(d, number);
    if (!f.has_value()) {
      ABSL_LOG(FATAL)
          << absl::StrFormat(
                 "%s has, by definition, a field numbered %d, but it could not "
                 "be "
                 "looked up; this is a bug",
                 TypeName(d), number);
    }
    return *f;
  }